

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov4.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__haystack;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 *in_RSI;
  int in_EDI;
  double dVar5;
  double dVar6;
  vector<Object,_std::allocator<Object>_> *pvVar7;
  Net *pNVar8;
  double t_draw_end;
  double t_draw_start;
  double t_detect_end;
  double t_detect_start;
  double t_capture_end;
  double t_capture_start;
  Mat *in_stack_000000b0;
  double t_load_end;
  int ret;
  double t_load_start;
  int is_streaming;
  int target_size;
  char *devicepath;
  Net yolov4;
  VideoCapture cap;
  vector<Object,_std::allocator<Object>_> objects;
  Mat frame;
  Net *in_stack_fffffffffffffd60;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  Net *in_stack_fffffffffffffd80;
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  string local_1a8 [32];
  Net *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffffe88;
  Mat *in_stack_fffffffffffffe90;
  VideoCapture local_b8 [72];
  Mat local_70 [96];
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  cv::Mat::Mat(local_70);
  std::vector<Object,_std::allocator<Object>_>::vector
            ((vector<Object,_std::allocator<Object>_> *)0x1417fb);
  cv::VideoCapture::VideoCapture(local_b8);
  ncnn::Net::Net(in_stack_fffffffffffffd80);
  bVar1 = false;
  if (local_8 < 2) {
    fprintf(_stderr,"Usage: %s [v4l input device or image]\n",*local_10);
    local_4 = -1;
  }
  else {
    __haystack = (char *)local_10[1];
    dVar5 = ncnn::get_current_time();
    uVar3 = init_yolov4((Net *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                        (int *)in_stack_fffffffffffffd70);
    if (uVar3 == 0) {
      dVar6 = ncnn::get_current_time();
      fprintf(_stdout,"NCNN Init time %.02lfms\n",dVar6 - dVar5);
      pcVar4 = strstr(__haystack,"/dev/video");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)local_10[1];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,pcVar4,&local_1c9);
        cv::imread(local_1a8,(int)local_1c8);
        cv::Mat::operator=(local_70,(Mat *)local_1a8);
        cv::Mat::~Mat((Mat *)local_1a8);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
        bVar2 = cv::Mat::empty();
        if ((bVar2 & 1) != 0) {
          fprintf(_stderr,"Failed to read image %s.\n",local_10[1]);
          local_4 = -1;
          goto LAB_00141eca;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,__haystack,&local_1f1);
        cv::VideoCapture::open((string *)local_b8,(int)local_1f0);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        bVar2 = cv::VideoCapture::isOpened();
        if ((bVar2 & 1) == 0) {
          fprintf(_stderr,"Failed to open %s",__haystack);
          local_4 = -1;
          goto LAB_00141eca;
        }
        cv::VideoCapture::operator>>(local_b8,local_70);
        bVar2 = cv::Mat::empty();
        if ((bVar2 & 1) != 0) {
          fprintf(_stderr,"Failed to read from device %s.\n",__haystack);
          local_4 = -1;
          goto LAB_00141eca;
        }
        bVar1 = true;
      }
      do {
        if (bVar1) {
          dVar5 = ncnn::get_current_time();
          cv::VideoCapture::operator>>(local_b8,local_70);
          dVar6 = ncnn::get_current_time();
          fprintf(_stdout,"NCNN OpenCV capture time %.02lfms\n",dVar6 - dVar5);
          bVar2 = cv::Mat::empty();
          if ((bVar2 & 1) != 0) {
            fprintf(_stderr,"OpenCV Failed to Capture from device %s\n",__haystack);
            local_4 = -1;
            goto LAB_00141eca;
          }
        }
        pvVar7 = (vector<Object,_std::allocator<Object>_> *)ncnn::get_current_time();
        in_stack_fffffffffffffd70 = pvVar7;
        detect_yolov4(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                      in_stack_fffffffffffffe78);
        dVar5 = ncnn::get_current_time();
        fprintf(_stdout,"NCNN detection time %.02lfms\n",dVar5 - (double)pvVar7);
        pNVar8 = (Net *)ncnn::get_current_time();
        in_stack_fffffffffffffd60 = pNVar8;
        draw_objects(in_stack_000000b0,(vector<Object,_std::allocator<Object>_> *)t_capture_start,
                     t_capture_end._4_4_);
        dVar5 = ncnn::get_current_time();
        fprintf(_stdout,"NCNN OpenCV draw result time %.02lfms\n",dVar5 - (double)pNVar8);
      } while (bVar1);
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"Failed to load model or param, error %d",(ulong)uVar3);
      local_4 = -1;
    }
  }
LAB_00141eca:
  ncnn::Net::~Net(in_stack_fffffffffffffd60);
  cv::VideoCapture::~VideoCapture(local_b8);
  std::vector<Object,_std::allocator<Object>_>::~vector(in_stack_fffffffffffffd70);
  cv::Mat::~Mat(local_70);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    cv::Mat frame;
    std::vector<Object> objects;

    cv::VideoCapture cap;

    ncnn::Net yolov4;

    const char* devicepath;

    int target_size = 0;
    int is_streaming = 0;

    if (argc < 2)
    {
        fprintf(stderr, "Usage: %s [v4l input device or image]\n", argv[0]);
        return -1;
    }

    devicepath = argv[1];

#ifdef NCNN_PROFILING
    double t_load_start = ncnn::get_current_time();
#endif

    int ret = init_yolov4(&yolov4, &target_size); //We load model and param first!
    if (ret != 0)
    {
        fprintf(stderr, "Failed to load model or param, error %d", ret);
        return -1;
    }

#ifdef NCNN_PROFILING
    double t_load_end = ncnn::get_current_time();
    fprintf(stdout, "NCNN Init time %.02lfms\n", t_load_end - t_load_start);
#endif

    if (strstr(devicepath, "/dev/video") == NULL)
    {
        frame = cv::imread(argv[1], 1);
        if (frame.empty())
        {
            fprintf(stderr, "Failed to read image %s.\n", argv[1]);
            return -1;
        }
    }
    else
    {
        cap.open(devicepath);

        if (!cap.isOpened())
        {
            fprintf(stderr, "Failed to open %s", devicepath);
            return -1;
        }

        cap >> frame;

        if (frame.empty())
        {
            fprintf(stderr, "Failed to read from device %s.\n", devicepath);
            return -1;
        }

        is_streaming = 1;
    }

    while (1)
    {
        if (is_streaming)
        {
#ifdef NCNN_PROFILING
            double t_capture_start = ncnn::get_current_time();
#endif

            cap >> frame;

#ifdef NCNN_PROFILING
            double t_capture_end = ncnn::get_current_time();
            fprintf(stdout, "NCNN OpenCV capture time %.02lfms\n", t_capture_end - t_capture_start);
#endif
            if (frame.empty())
            {
                fprintf(stderr, "OpenCV Failed to Capture from device %s\n", devicepath);
                return -1;
            }
        }

#ifdef NCNN_PROFILING
        double t_detect_start = ncnn::get_current_time();
#endif

        detect_yolov4(frame, objects, target_size, &yolov4); //Create an extractor and run detection

#ifdef NCNN_PROFILING
        double t_detect_end = ncnn::get_current_time();
        fprintf(stdout, "NCNN detection time %.02lfms\n", t_detect_end - t_detect_start);
#endif

#ifdef NCNN_PROFILING
        double t_draw_start = ncnn::get_current_time();
#endif

        draw_objects(frame, objects, is_streaming); //Draw detection results on opencv image

#ifdef NCNN_PROFILING
        double t_draw_end = ncnn::get_current_time();
        fprintf(stdout, "NCNN OpenCV draw result time %.02lfms\n", t_draw_end - t_draw_start);
#endif

        if (!is_streaming)
        {   //If it is a still image, exit!
            return 0;
        }
    }

    return 0;
}